

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_regular_transfer(Curl_easy *data,_Bool *dophase_done)

{
  connectdata *pcVar1;
  ftp_conn *ftpc;
  connectdata *conn;
  _Bool connected;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *dophase_done_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  conn._3_1_ = 0;
  pcVar1 = data->conn;
  (data->req).size = -1;
  p_Stack_20 = dophase_done;
  dophase_done_local = (_Bool *)data;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter((Curl_easy *)dophase_done_local,0);
  Curl_pgrsSetUploadSize((Curl_easy *)dophase_done_local,-1);
  Curl_pgrsSetDownloadSize((Curl_easy *)dophase_done_local,-1);
  *(byte *)((long)&pcVar1->proto + 0x112) = *(byte *)((long)&pcVar1->proto + 0x112) & 0xfb | 4;
  conn._4_4_ = ftp_perform((Curl_easy *)dophase_done_local,(_Bool *)((long)&conn + 3),p_Stack_20);
  if (conn._4_4_ == CURLE_OK) {
    if ((*p_Stack_20 & 1U) == 0) {
      return CURLE_OK;
    }
    conn._4_4_ = ftp_dophase_done((Curl_easy *)dophase_done_local,(_Bool)(conn._3_1_ & 1));
    if (conn._4_4_ != CURLE_OK) {
      return conn._4_4_;
    }
  }
  else {
    freedirs(&(pcVar1->proto).ftpc);
  }
  return conn._4_4_;
}

Assistant:

static
CURLcode ftp_regular_transfer(struct Curl_easy *data,
                              bool *dophase_done)
{
  CURLcode result = CURLE_OK;
  bool connected = FALSE;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  data->req.size = -1; /* make sure this is unknown at this point */

  Curl_pgrsSetUploadCounter(data, 0);
  Curl_pgrsSetDownloadCounter(data, 0);
  Curl_pgrsSetUploadSize(data, -1);
  Curl_pgrsSetDownloadSize(data, -1);

  ftpc->ctl_valid = TRUE; /* starts good */

  result = ftp_perform(data,
                       &connected, /* have we connected after PASV/PORT */
                       dophase_done); /* all commands in the DO-phase done? */

  if(!result) {

    if(!*dophase_done)
      /* the DO phase has not completed yet */
      return CURLE_OK;

    result = ftp_dophase_done(data, connected);

    if(result)
      return result;
  }
  else
    freedirs(ftpc);

  return result;
}